

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

bool llvm::sys::path::remove_dots(SmallVectorImpl<char> *path,bool remove_dot_dot,Style style)

{
  char *pcVar1;
  StringRef path_00;
  undefined8 uVar2;
  undefined4 uVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 __ptr [8];
  undefined7 in_register_00000031;
  Style in_R8D;
  Twine *pTVar8;
  ulong uVar9;
  long lVar10;
  StringRef SVar11;
  StringRef path_01;
  undefined1 local_338 [8];
  SmallString<256U> result;
  undefined1 local_210 [8];
  SmallVector<llvm::StringRef,_16U> components;
  short *local_f0;
  long lStack_e8;
  long local_e0;
  Twine local_d0;
  Child local_b8 [2];
  short *local_a8;
  long lStack_a0;
  long local_98;
  undefined1 auStack_88 [8];
  StringRef C_1;
  StringRef C;
  StringRef local_50;
  undefined8 local_40;
  Style local_34;
  
  pcVar1 = (char *)(path->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  uVar2 = (path->super_SmallVectorTemplateBase<char,_true>).
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  uVar3 = (path->super_SmallVectorTemplateBase<char,_true>).
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  SVar11.Length._0_4_ = uVar3;
  SVar11.Data = (char *)uVar2;
  uVar9 = (ulong)(path->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  local_210 = (undefined1  [8])
              &components.super_SmallVectorImpl<llvm::StringRef>.
               super_SmallVectorTemplateBase<llvm::StringRef,_true>.
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size;
  components.super_SmallVectorImpl<llvm::StringRef>.
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX =
       (void *)0x1000000000;
  SVar11.Length._4_4_ = 0;
  local_50.Data = pcVar1;
  local_50.Length = uVar9;
  local_34 = style;
  local_40._0_4_ = (int)CONCAT71(in_register_00000031,remove_dot_dot);
  SVar11 = root_path(SVar11,style);
  uVar7 = SVar11.Length;
  if (uVar9 < SVar11.Length) {
    uVar7 = uVar9;
  }
  pTVar8 = (Twine *)(pcVar1 + uVar7);
  path_01.Length._0_4_ = local_34;
  path_01.Data = (char *)(uVar9 - uVar7);
  path_01.Length._4_4_ = 0;
  begin((const_iterator *)
        (components.super_SmallVectorStorage<llvm::StringRef,_16U>.InlineElts[0xf].buffer + 8),
        (path *)pTVar8,path_01,in_R8D);
  local_98 = local_e0;
  local_a8 = local_f0;
  lStack_a0 = lStack_e8;
  local_b8[0] = (Child)components.super_SmallVectorStorage<llvm::StringRef,_16U>.InlineElts[0xf].
                       buffer._8_8_;
  local_40 = (uint *)(CONCAT44(local_40._4_4_,(undefined4)local_40) ^ 1);
  do {
    if ((local_b8[0].twine == pTVar8) && (local_98 == uVar9 - uVar7)) {
      path_00.Length = local_50.Length;
      path_00.Data = local_50.Data;
      SVar11 = root_path(path_00,local_34);
      SmallVector<char,256u>::SmallVector<char_const*,void>
                ((SmallVector<char,256u> *)local_338,SVar11.Data,SVar11.Data + SVar11.Length);
      uVar7 = (ulong)components.super_SmallVectorImpl<llvm::StringRef>.
                     super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                     super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                     BeginX & 0xffffffff;
      if (uVar7 != 0) {
        local_40 = (uint *)local_210;
        lVar10 = 0;
        pTVar8 = (Twine *)(result.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>
                           .InlineElts + 0xf8);
        do {
          auStack_88 = *(undefined1 (*) [8])((long)local_40 + lVar10);
          C_1.Data = (char *)((undefined8 *)((long)local_40 + lVar10))[1];
          Twine::Twine((Twine *)local_b8,(StringRef *)auStack_88);
          Twine::Twine(&local_d0,"");
          Twine::Twine((Twine *)&C_1.Length,"");
          Twine::Twine(pTVar8,"");
          append((SmallVectorImpl<char> *)local_338,local_34,(Twine *)local_b8,&local_d0,
                 (Twine *)&C_1.Length,pTVar8);
          lVar10 = lVar10 + 0x10;
        } while (uVar7 << 4 != lVar10);
      }
      if (local_210 !=
          (undefined1  [8])
          &components.super_SmallVectorImpl<llvm::StringRef>.
           super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size) {
        free((void *)local_210);
      }
      __ptr = local_338;
      if (((uint)result.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                 super_SmallVectorTemplateBase<char,_true>.
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX ==
           (path->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size) &&
         (((ulong)(uint)result.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                        super_SmallVectorTemplateBase<char,_true>.
                        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX ==
           0 || (iVar5 = bcmp((void *)local_338,
                              (path->super_SmallVectorTemplateBase<char,_true>).
                              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                              BeginX,(ulong)(uint)result.super_SmallVector<char,_256U>.
                                                  super_SmallVectorImpl<char>.
                                                  super_SmallVectorTemplateBase<char,_true>.
                                                  super_SmallVectorTemplateCommon<char,_void>.
                                                  super_SmallVectorBase.BeginX), iVar5 == 0)))) {
        bVar4 = false;
      }
      else {
        SmallVectorImpl<char>::swap(path,(SmallVectorImpl<char> *)local_338);
        bVar4 = true;
        __ptr = local_338;
      }
      if (__ptr != (undefined1  [8])
                   &result.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                    super_SmallVectorTemplateBase<char,_true>.
                    super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size) {
        free((void *)__ptr);
      }
      return bVar4;
    }
    C_1.Length = (size_t)local_a8;
    if (lStack_a0 == 1) {
      if ((char)*local_a8 == '.') goto LAB_00d9b502;
LAB_00d9b4f2:
      SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
                ((SmallVectorTemplateBase<llvm::StringRef,_true> *)local_210,
                 (StringRef *)&C_1.Length);
    }
    else {
      if ((lStack_a0 != 2 || (char)local_40 != '\0') || (*local_a8 != 0x2e2e)) goto LAB_00d9b4f2;
      uVar6 = (ulong)components.super_SmallVectorImpl<llvm::StringRef>.
                     super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                     super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                     BeginX & 0xffffffff;
      if ((uVar6 == 0) ||
         ((*(long *)((long)local_210 + (uVar6 * 4 + -2) * 4) == 2 &&
          (**(short **)((long)local_210 + (uVar6 * 4 + -4) * 4) == 0x2e2e)))) {
        Twine::Twine(&local_d0,&local_50);
        bVar4 = is_absolute(&local_d0,local_34);
        if (!bVar4) goto LAB_00d9b4f2;
      }
      else {
        if ((ulong)components.super_SmallVectorImpl<llvm::StringRef>.
                   super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                   super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                   BeginX._4_4_ < uVar6 - 1) {
          __assert_fail("N <= capacity()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                        ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
        }
        components.super_SmallVectorImpl<llvm::StringRef>.
        super_SmallVectorTemplateBase<llvm::StringRef,_true>.
        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX =
             (void *)CONCAT44(components.super_SmallVectorImpl<llvm::StringRef>.
                              super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                              super_SmallVectorBase.BeginX._4_4_,(int)(uVar6 - 1));
      }
    }
LAB_00d9b502:
    const_iterator::operator++((const_iterator *)local_b8);
  } while( true );
}

Assistant:

bool remove_dots(SmallVectorImpl<char> &path, bool remove_dot_dot,
                 Style style) {
  StringRef p(path.data(), path.size());

  SmallString<256> result = remove_dots(p, remove_dot_dot, style);
  if (result == path)
    return false;

  path.swap(result);
  return true;
}